

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithNaturalBoxes(Gia_Man_t *p,int nFaddMin,int fVerbose)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Int_t *vFadds;
  Vec_Int_t *vMap;
  Vec_Wec_t *vChains;
  Vec_Int_t *pVVar4;
  Vec_Int_t *p_00;
  abctime aVar5;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *vChain;
  Tim_Man_t *pTVar9;
  Gia_Man_t *pGVar10;
  Vec_Int_t *vMap_00;
  Vec_Int_t *extraout_RDX;
  abctime time;
  abctime time_00;
  int iVar11;
  int nBoxes;
  
  aVar3 = Abc_Clock();
  iVar1 = Gia_ManBoxNum(p);
  if (iVar1 < 1) {
    iVar1 = Gia_ManBoxNum(p);
    if (iVar1 != 0) {
      __assert_fail("Gia_ManBoxNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x322,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
    }
    vFadds = Gia_ManDetectFullAdders(p,fVerbose,(Vec_Int_t **)0x0);
    if (vFadds->nSize % 5 != 0) {
      __assert_fail("Vec_IntSize(vFadds) % 5 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x326,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
    }
    vMap = Gia_ManCreateMap(p,vFadds);
    Gia_ManFindChains(p,vFadds,vMap);
    pGVar6 = p;
    vChains = Gia_ManCollectTopmost(p,vFadds,vMap,nFaddMin);
    pVVar4 = vMap_00;
    if (fVerbose != 0) {
      Gia_ManPrintChains(pGVar6,vFadds,vMap_00,vChains);
      pVVar4 = extraout_RDX;
    }
    iVar1 = vChains->nSize;
    if (iVar1 == 0) {
      Vec_IntFree(vFadds);
      Vec_IntFree(vMap);
      Vec_WecFree(vChains);
      pGVar6 = Gia_ManDup(p);
      return pGVar6;
    }
    pVVar4 = Gia_ManFindMapping(p,vFadds,pVVar4,vChains);
    p_00 = Gia_ManCollectTruthTables(p,vFadds);
    if (fVerbose != 0) {
      aVar5 = Abc_Clock();
      Abc_PrintTime(0x840d60,(char *)(aVar5 - aVar3),time);
    }
    aVar3 = Abc_Clock();
    Gia_ManFillValue(p);
    pGVar6 = Gia_ManStart(p->nObjs);
    pcVar7 = Abc_UtilStrsav(p->pName);
    pGVar6->pName = pcVar7;
    pcVar7 = Abc_UtilStrsav(p->pSpec);
    pGVar6->pSpec = pcVar7;
    p->pObjs->Value = 0;
    for (iVar11 = 0; iVar11 < p->vCis->nSize; iVar11 = iVar11 + 1) {
      pGVar8 = Gia_ManCi(p,iVar11);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      uVar2 = Gia_ManAppendCi(pGVar6);
      pGVar8->Value = uVar2;
    }
    for (iVar11 = 0; iVar11 < iVar1; iVar11 = iVar11 + 1) {
      vChain = Vec_WecEntry(vChains,iVar11);
      Gia_ManDupFadd(pGVar6,p,vChain,vFadds,vMap,vChains,pVVar4,p_00);
      iVar1 = vChains->nSize;
    }
    for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
      pGVar8 = Gia_ManCo(p,iVar1);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      Gia_ManDupWithFaddBoxes_rec
                (pGVar6,p,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),vFadds,vMap,
                 vChains,pVVar4,p_00);
    }
    for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
      pGVar8 = Gia_ManCo(p,iVar1);
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      iVar11 = Gia_ObjFanin0Copy(pGVar8);
      Gia_ManAppendCo(pGVar6,iVar11);
    }
    Gia_ManSetRegNum(pGVar6,p->nRegs);
    if (p->nRegs != 0) {
      if (fVerbose != 0) {
        puts("Warning: Sequential design is coverted into combinational one by adding white boxes.")
        ;
      }
      pGVar6->nRegs = 0;
    }
    iVar1 = Gia_ManHasDangling(pGVar6);
    if (iVar1 != 0) {
      __assert_fail("!Gia_ManHasDangling(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x353,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
    }
    Vec_IntFree(vFadds);
    Vec_IntFree(vMap);
    Vec_WecFree(vChains);
    Vec_IntFree(pVVar4);
    Vec_IntFree(p_00);
    iVar1 = p->vCis->nSize;
    nBoxes = (pGVar6->vCis->nSize - iVar1) / 2;
    iVar11 = p->vCos->nSize;
    if (nBoxes != (pGVar6->vCos->nSize - iVar11) / 3) {
      __assert_fail("nBoxes == (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0x35e,"Gia_Man_t *Gia_ManDupWithNaturalBoxes(Gia_Man_t *, int, int)");
    }
    pTVar9 = Gia_ManGenerateTim(iVar1,iVar11,nBoxes,3,2);
    pGVar6->pManTime = pTVar9;
    pGVar10 = Gia_ManGenerateExtraAig(nBoxes,3,2);
    pGVar6->pAigExtra = pGVar10;
    if (fVerbose != 0) {
      aVar5 = Abc_Clock();
      Abc_PrintTime(0x840db0,(char *)(aVar5 - aVar3),time_00);
    }
  }
  else {
    puts("Currently natural carry-chains cannot be detected when boxes are present.");
    pGVar6 = (Gia_Man_t *)0x0;
  }
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupWithNaturalBoxes( Gia_Man_t * p, int nFaddMin, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;//, * pTemp;
    Vec_Int_t * vFadds, * vMap, * vMap2Chain, * vTruths, * vChain;
    Vec_Wec_t * vChains;
    Gia_Obj_t * pObj;  
    int i, nBoxes;
    if ( Gia_ManBoxNum(p) > 0 )
    {
        printf( "Currently natural carry-chains cannot be detected when boxes are present.\n" );
        return NULL;
    }
    assert( Gia_ManBoxNum(p) == 0 );

    // detect FADDs
    vFadds = Gia_ManDetectFullAdders( p, fVerbose, NULL );
    assert( Vec_IntSize(vFadds) % 5 == 0 );
    // map MAJ into its FADD
    vMap = Gia_ManCreateMap( p, vFadds );
    // for each FADD, find the longest chain and reorder its inputs
    Gia_ManFindChains( p, vFadds, vMap );
    // returns the set of topmost MAJ nodes
    vChains = Gia_ManCollectTopmost( p, vFadds, vMap, nFaddMin );
    if ( fVerbose )
        Gia_ManPrintChains( p, vFadds, vMap, vChains );
    if ( Vec_WecSize(vChains) == 0 )
    {
        Vec_IntFree( vFadds );
        Vec_IntFree( vMap );
        Vec_WecFree( vChains );
        return Gia_ManDup( p );
    }
    // returns mapping of each MAJ into the topmost elements of its chain
    vMap2Chain = Gia_ManFindMapping( p, vFadds, vMap, vChains );
    // compute truth tables for FADDs
    vTruths = Gia_ManCollectTruthTables( p, vFadds );
    if ( fVerbose )
        Abc_PrintTime( 1, "Carry-chain detection time", Abc_Clock() - clk );

    // duplicate
    clk = Abc_Clock();
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Vec_WecForEachLevel( vChains, vChain, i )
        Gia_ManDupFadd( pNew, p, vChain, vFadds, vMap, vChains, vMap2Chain, vTruths );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupWithFaddBoxes_rec( pNew, p, Gia_ObjFanin0(pObj), vFadds, vMap, vChains, vMap2Chain, vTruths );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( Gia_ManRegNum(p) )
    {
        if ( fVerbose )
            printf( "Warning: Sequential design is coverted into combinational one by adding white boxes.\n" );
        pNew->nRegs = 0;
    }
    assert( !Gia_ManHasDangling(pNew) );

    // cleanup
    Vec_IntFree( vFadds );
    Vec_IntFree( vMap );
    Vec_WecFree( vChains );
    Vec_IntFree( vMap2Chain );
    Vec_IntFree( vTruths );
    
    // other information
    nBoxes = (Gia_ManCiNum(pNew) - Gia_ManCiNum(p)) / 2;
    assert( nBoxes == (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3 );
    pNew->pManTime  = Gia_ManGenerateTim( Gia_ManCiNum(p), Gia_ManCoNum(p), nBoxes, 3, 2 );
    pNew->pAigExtra = Gia_ManGenerateExtraAig( nBoxes, 3, 2 );
/*
    // normalize
    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    pNew->pManTime  = pTemp->pManTime;  pTemp->pManTime  = NULL;
    pNew->pAigExtra = pTemp->pAigExtra; pTemp->pAigExtra = NULL;
    Gia_ManStop( pTemp );
*/
    //pNew = Gia_ManDupCollapse( pTemp = pNew, pNew->pAigExtra, NULL );
    //Gia_ManStop( pTemp );

    //Gia_ManIllustrateBoxes( pNew );
    if ( fVerbose )
        Abc_PrintTime( 1, "AIG with boxes construction time", Abc_Clock() - clk );
    return pNew;
}